

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void dispatchByMode(Problem *problem)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  
  lVar1 = Lib::env;
  switch(*(undefined4 *)(Lib::env + 0x7500)) {
  case 0:
    axiomSelectionMode(problem);
    return;
  case 1:
    *(undefined4 *)(Lib::env + 0x4fc8) = 2;
    *(uint *)(lVar1 + 0x7700) = (uint)(*(int *)(lVar1 + 0x7600) != 0) * 2;
    *(undefined4 *)(lVar1 + 0x5470) = 1;
    *(undefined4 *)(lVar1 + 0xd260) = 2;
    *(undefined4 *)(lVar1 + 0x83d0) = 3;
    *(undefined1 *)(lVar1 + 0x7fea) = 1;
    *(undefined1 *)(lVar1 + 0x7d62) = 1;
    *(undefined1 *)(lVar1 + 0x7ad2) = 0;
    break;
  case 2:
    bVar2 = false;
    goto LAB_0017bd09;
  case 3:
  case 0xe:
    vampireMode(problem);
    return;
  case 4:
    modelCheckMode(problem);
    return;
  case 5:
    outputMode(problem);
    return;
  case 6:
    *(undefined4 *)(Lib::env + 0x4fc8) = 2;
    break;
  case 7:
  case 8:
    bVar2 = false;
    goto LAB_0017bbf6;
  case 9:
    profileMode(problem);
    return;
  case 10:
    *(undefined4 *)(Lib::env + 0x4fc8) = 1;
    *(undefined4 *)(lVar1 + 0x5470) = 0;
    if (*(int *)(lVar1 + 0xd260) != 4) {
      *(undefined4 *)(lVar1 + 0xd260) = 0;
    }
    *(undefined4 *)(lVar1 + 0x7700) = 0xd;
    *(undefined4 *)(lVar1 + 0x83d0) = 0;
    *(undefined1 *)(lVar1 + 0x7d62) = 1;
    *(undefined1 *)(lVar1 + 0x7ad2) = 0;
    *(undefined4 *)(lVar1 + 31000) = 0;
    *(undefined4 *)(lVar1 + 0xc220) = 2;
    *(undefined4 *)(lVar1 + 0xd800) = 1000000;
    bVar2 = CASC::PortfolioMode::perform(problem);
    if (!bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"unknown");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    goto LAB_0017bcfd;
  case 0xb:
    spiderMode(problem);
    return;
  case 0xc:
    bVar2 = true;
LAB_0017bd09:
    clausifyMode(problem,bVar2);
    return;
  case 0xd:
    bVar2 = true;
LAB_0017bbf6:
    preprocessMode(problem,bVar2);
    return;
  default:
    goto switchD_0017bbe7_default;
  }
  bVar2 = CASC::PortfolioMode::perform(problem);
  if (bVar2) {
LAB_0017bcfd:
    vampireReturnValue = 0;
  }
switchD_0017bbe7_default:
  return;
}

Assistant:

void dispatchByMode(Problem* problem)
{
  switch (env.options->mode())
  {
  case Options::Mode::AXIOM_SELECTION:
    axiomSelectionMode(problem);
    break;
  case Options::Mode::SPIDER:
    spiderMode(problem);
    break;
  case Options::Mode::CONSEQUENCE_ELIMINATION:
  case Options::Mode::VAMPIRE:
    vampireMode(problem);
    break;

  case Options::Mode::CASC:
    env.options->setIgnoreMissing(Options::IgnoreMissing::WARN);
    if (env.options->intent() == Options::Intent::UNSAT) {
      env.options->setSchedule(Options::Schedule::CASC);
    } else {
      env.options->setSchedule(Options::Schedule::CASC_SAT);
    }
    env.options->setInputSyntax(Options::InputSyntax::TPTP);
    env.options->setOutputMode(Options::Output::SZS);
    env.options->setProof(Options::Proof::TPTP);
    env.options->setOutputAxiomNames(true);
    env.options->setNormalize(true);
    env.options->setRandomizeSeedForPortfolioWorkers(false);

    if (CASC::PortfolioMode::perform(problem)) {
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    break;

  case Options::Mode::SMTCOMP:
    env.options->setIgnoreMissing(Options::IgnoreMissing::OFF);
    env.options->setInputSyntax(Options::InputSyntax::SMTLIB2);
    if(env.options->outputMode() != Options::Output::UCORE){
      env.options->setOutputMode(Options::Output::SMTCOMP);
    }
    env.options->setSchedule(Options::Schedule::SMTCOMP);
    env.options->setProof(Options::Proof::OFF);
    env.options->setNormalize(true);
    env.options->setRandomizeSeedForPortfolioWorkers(false);

    env.options->setMulticore(0); // use all available cores
    env.options->setTimeLimitInSeconds(1800);
    env.options->setStatistics(Options::Statistics::NONE);

    //TODO needed?
    // to prevent from terminating by time limit
    env.options->setTimeLimitInSeconds(100000);

    if (CASC::PortfolioMode::perform(problem)){
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    else {
      cout << "unknown" << endl;
    }
    break;

  case Options::Mode::PORTFOLIO:
    env.options->setIgnoreMissing(Options::IgnoreMissing::WARN);

    if (CASC::PortfolioMode::perform(problem)) {
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
    }
    break;
  case Options::Mode::MODEL_CHECK:
    modelCheckMode(problem);
    break;

  case Options::Mode::CLAUSIFY:
    clausifyMode(problem,false);
    break;

  case Options::Mode::TCLAUSIFY:
    clausifyMode(problem,true);
    break;

  case Options::Mode::OUTPUT:
    outputMode(problem);
    break;

  case Options::Mode::PROFILE:
    profileMode(problem);
    break;

  case Options::Mode::PREPROCESS:
  case Options::Mode::PREPROCESS2:
    preprocessMode(problem,false);
    break;

  case Options::Mode::TPREPROCESS:
    preprocessMode(problem,true);
    break;
  }
}